

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

size_t axl::err::pushError(StringRef *string)

{
  size_t sVar1;
  ErrorRef *unaff_retaddr;
  size_t result;
  Error error;
  undefined8 local_58;
  StringRef *in_stack_ffffffffffffffc0;
  Error *in_stack_ffffffffffffffc8;
  
  Error::Error((Error *)0x132048);
  sVar1 = Error::createStringError(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (sVar1 == 0xffffffffffffffff) {
    local_58 = 0xffffffffffffffff;
  }
  else {
    local_58 = pushError(unaff_retaddr);
  }
  Error::~Error((Error *)0x1320af);
  return local_58;
}

Assistant:

size_t
pushError(const sl::StringRef& string) {
	Error error;
	size_t result = error.createStringError(string);
	return result != -1 ? pushError(error) : -1;
}